

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-embed.c
# Opt level: O1

void embed_thread_runner(void *arg)

{
  int __epfd;
  int __timeout;
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  epoll_event ev;
  
  if (embed_closed != 0) {
    return;
  }
  do {
    uVar2 = uv_default_loop();
    __epfd = uv_backend_fd(uVar2);
    uVar2 = uv_default_loop();
    __timeout = uv_backend_timeout(uVar2);
    do {
      iVar1 = epoll_wait(__epfd,(epoll_event *)&stack0xffffffffffffffcc,1,__timeout);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    uv_async_send(&embed_async);
    uv_sem_wait(&embed_sem);
    if (embed_closed != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void embed_thread_runner(void* arg) {
  int r;
  int fd;
  int timeout;

  while (!embed_closed) {
    fd = uv_backend_fd(uv_default_loop());
    timeout = uv_backend_timeout(uv_default_loop());

    do {
#if defined(HAVE_KQUEUE)
      struct timespec ts;
      ts.tv_sec = timeout / 1000;
      ts.tv_nsec = (timeout % 1000) * 1000000;
      r = kevent(fd, NULL, 0, NULL, 0, &ts);
#elif defined(HAVE_EPOLL)
      {
        struct epoll_event ev;
        r = epoll_wait(fd, &ev, 1, timeout);
      }
#endif
    } while (r == -1 && errno == EINTR);
    uv_async_send(&embed_async);
    uv_sem_wait(&embed_sem);
  }
}